

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  uint *puVar1;
  uint uVar2;
  ushort uVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  
  this->m_arith_total_bits = this->m_arith_total_bits + 1;
  uVar3 = model->m_bit_0_prob;
  uVar7 = (this->m_output_syms).m_size;
  if (((this->m_output_syms).m_capacity <= uVar7) &&
     (bVar5 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_output_syms,uVar7 + 1,true,8,(object_mover)0x0
                         ,true), !bVar5)) {
    return false;
  }
  (this->m_output_syms).m_p[(this->m_output_syms).m_size] =
       (output_symbol)((ulong)bit | (ulong)uVar3 << 0x30 | 0xffff00000000);
  puVar1 = &(this->m_output_syms).m_size;
  *puVar1 = *puVar1 + 1;
  uVar3 = model->m_bit_0_prob;
  uVar7 = this->m_arith_length;
  uVar6 = (uVar7 >> 0xb) * (uint)uVar3;
  if (bit == 0) {
    if (update_model) {
      model->m_bit_0_prob = (short)(0x800 - uVar3 >> 5) + uVar3;
    }
    this->m_arith_length = uVar6;
  }
  else {
    if (update_model) {
      model->m_bit_0_prob = uVar3 - (uVar3 >> 5);
    }
    puVar1 = &this->m_arith_base;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar6;
    this->m_arith_length = uVar7 - uVar6;
    if (CARRY4(uVar2,uVar6)) {
      uVar7 = (this->m_arith_output_buf).m_size;
      while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
        puVar4 = (this->m_arith_output_buf).m_p;
        if (puVar4[uVar7] != 0xff) {
          puVar4[uVar7] = puVar4[uVar7] + '\x01';
          break;
        }
        puVar4[uVar7] = '\0';
      }
    }
  }
  if ((0xffffff < this->m_arith_length) || (bVar5 = arith_renorm_enc_interval(this), bVar5)) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      m_arith_total_bits++;

      output_symbol sym;
      sym.m_bits = bit;
      sym.m_num_bits = -1;
      sym.m_arith_prob0 = model.m_bit_0_prob;
      if (!m_output_syms.try_push_back(sym))
         return false;

      uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

      if (!bit)
      {
         if (update_model)
            model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);

         m_arith_length = x;
      }
      else
      {
         if (update_model)
            model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);

         uint orig_base = m_arith_base;
         m_arith_base   += x;
         m_arith_length -= x;
         if (orig_base > m_arith_base)
            arith_propagate_carry();
      }

      if (m_arith_length < cSymbolCodecArithMinLen)
      {
         if (!arith_renorm_enc_interval())
            return false;
      }

      return true;
   }